

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# album.cpp
# Opt level: O3

void __thiscall album::add_song(album *this,song *_song)

{
  int iVar1;
  song *this_00;
  int *piVar2;
  pointer *__ptr;
  _Head_base<0UL,_song_*,_false> local_28;
  
  this_00 = (song *)operator_new(0x98);
  song::song(this_00,_song);
  local_28._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<song,std::default_delete<song>>,std::allocator<std::unique_ptr<song,std::default_delete<song>>>>
  ::emplace_back<std::unique_ptr<song,std::default_delete<song>>>
            ((vector<std::unique_ptr<song,std::default_delete<song>>,std::allocator<std::unique_ptr<song,std::default_delete<song>>>>
              *)&this->songs,(unique_ptr<song,_std::default_delete<song>_> *)&local_28);
  if (local_28._M_head_impl != (song *)0x0) {
    std::default_delete<song>::operator()((default_delete<song> *)&local_28,local_28._M_head_impl);
  }
  iVar1 = song::get_seconds(_song);
  iVar1 = iVar1 + this->length;
  this->length = iVar1;
  if (iVar1 < 0x1c21) {
    return;
  }
  piVar2 = (int *)__cxa_allocate_exception(4);
  *piVar2 = this->length;
  __cxa_throw(piVar2,&int::typeinfo,0);
}

Assistant:

void album::add_song( const song &_song ){

    try{
        songs.push_back( std::make_unique < song > ( _song ) );
        length += _song.get_seconds();
        if( length > 7200 ) throw( length );
    }
    catch ( int length ){
        std::cout << name << " lasts longer than 2h [nobody will listen to it]\n";
    }

}